

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall
icu_63::NumeratorSubstitution::NumeratorSubstitution
          (NumeratorSubstitution *this,int32_t _pos,double _denominator,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  UBool UVar1;
  int64_t iVar2;
  ConstChar16Ptr local_90;
  double local_88;
  UnicodeString local_70;
  
  local_88 = _denominator;
  fixdesc(&local_70,description);
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__NumeratorSubstitution_003a6600;
  this->denominator = local_88;
  iVar2 = util64_fromDouble(local_88);
  this->ldenominator = iVar2;
  local_90.p_ = 
  L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E똵\xfff6뙩\xfff6뙈\xfff6뙗\xfff6띀\xfff6띮\xfff6뜊\xfff6띮\xfff6띮\xfff6띮\xfff6띀\xfff6띮\xfff6띀\xfff6묖\xfff6묖\xfff6묠\xfff6뭫\xfff6뭉\xfff6뭚\xfff6묧\xfff6문\xfff6뭲\xfff6맻\xfff6뭜\xfff6멧\xfff6먶\xfff6멃\xfff6먡\xfff6멽\xfff6몕\xfff6멛\xfff6목\xfff6뮏\xfff6뭯\xfff6맯\xfff6뭯\xfff6뭯\xfff6뭯\xfff6뭿\xfff6뭯\xfff6뮟\xfff6㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
  ;
  UVar1 = UnicodeString::endsWith(description,&local_90,2);
  this->withZeros = UVar1;
  return;
}

Assistant:

NumeratorSubstitution(int32_t _pos,
        double _denominator,
        NFRuleSet* _ruleSet,
        const UnicodeString& description,
        UErrorCode& status)
        : NFSubstitution(_pos, _ruleSet, fixdesc(description), status), denominator(_denominator) 
    {
        ldenominator = util64_fromDouble(denominator);
        withZeros = description.endsWith(LTLT, 2);
    }